

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int send_data_blocked(quicly_conn_t *conn,quicly_send_context_t *s)

{
  int iVar1;
  uint8_t *puVar2;
  quicly_send_context_t *in_RSI;
  quicly_conn_t *in_RDI;
  uint64_t offset;
  int ret;
  quicly_sent_t *sent;
  quicly_sent_acked_cb acked;
  uint in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  size_t in_stack_ffffffffffffffe8;
  
  acked = (quicly_sent_acked_cb)(in_RDI->egress).max_data.permitted;
  iVar1 = allocate_ack_eliciting_frame
                    (in_RDI,in_RSI,in_stack_ffffffffffffffe8,
                     (quicly_sent_t **)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0)
                     ,acked);
  if (iVar1 == 0) {
    *(quicly_sent_acked_cb *)(in_stack_ffffffffffffffe8 + 8) = acked;
    puVar2 = quicly_encode_data_blocked_frame
                       ((uint8_t *)(ulong)in_stack_ffffffffffffffe0,(uint64_t)acked);
    in_RSI->dst = puVar2;
    (in_RDI->egress).data_blocked = QUICLY_SENDER_STATE_UNACKED;
    (in_RDI->super).stats.num_frames_sent.data_blocked =
         (in_RDI->super).stats.num_frames_sent.data_blocked + 1;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int send_data_blocked(quicly_conn_t *conn, quicly_send_context_t *s)
{
    quicly_sent_t *sent;
    int ret;

    uint64_t offset = conn->egress.max_data.permitted;
    if ((ret = allocate_ack_eliciting_frame(conn, s, QUICLY_DATA_BLOCKED_FRAME_CAPACITY, &sent, on_ack_data_blocked)) != 0)
        goto Exit;
    sent->data.data_blocked.offset = offset;
    s->dst = quicly_encode_data_blocked_frame(s->dst, offset);
    conn->egress.data_blocked = QUICLY_SENDER_STATE_UNACKED;

    ++conn->super.stats.num_frames_sent.data_blocked;
    QUICLY_PROBE(DATA_BLOCKED_SEND, conn, conn->stash.now, offset);

    ret = 0;
Exit:
    return ret;
}